

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
atoiTest_testInt64OutOfBoundsHigh_Test::atoiTest_testInt64OutOfBoundsHigh_Test
          (atoiTest_testInt64OutOfBoundsHigh_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00154078;
  return;
}

Assistant:

TEST(atoiTest, testInt64OutOfBoundsHigh) {
  // out of bounds
  test<int64_t>(false, "9223372036854775808"); 
  test<int64_t>(false, "9223372036854775809"); 
  test<int64_t>(false, "18446744073709551610");
  test<int64_t>(false, "18446744073709551614");
  test<int64_t>(false, "18446744073709551615");
  test<int64_t>(false, "18446744073709551616");
  test<int64_t>(false, "118446744073709551612");
  test<int64_t>(false, "111111111111111111111111111111");
  test<int64_t>(false, "11111111111111111111111111111111111111111111111111111111111111111");
}